

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getChargeMomentum(Thermo *this)

{
  Snapshot *this_00;
  pointer ppAVar1;
  Atom *pAVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  double cMom;
  RealType RVar5;
  MoleculeIterator miter;
  MoleculeIterator local_20;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasChargeMomentum == false) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar3 = SimInfo::beginMolecule(this->info_,&local_20);
    cMom = 0.0;
    if (pMVar3 != (Molecule *)0x0) {
      do {
        ppAVar4 = (pMVar3->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar1 = (pMVar3->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar4 != ppAVar1) {
          pAVar2 = *ppAVar4;
          while (pAVar2 != (Atom *)0x0) {
            ppAVar4 = ppAVar4 + 1;
            cMom = pAVar2->chargeMass_ *
                   *(double *)
                    (*(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQVel.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar2->super_StuntDouble).storage_) +
                    (long)(pAVar2->super_StuntDouble).localIndex_ * 8) + cMom;
            if (ppAVar4 == ppAVar1) break;
            pAVar2 = *ppAVar4;
          }
        }
        pMVar3 = SimInfo::nextMolecule(this->info_,&local_20);
      } while (pMVar3 != (Molecule *)0x0);
    }
    Snapshot::setChargeMomentum(this_00,cMom);
  }
  RVar5 = Snapshot::getChargeMomentum(this_00);
  return RVar5;
}

Assistant:

RealType Thermo::getChargeMomentum() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasChargeMomentum) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator iiter;
      Molecule* mol;
      Atom* atom;
      RealType cvel;
      RealType cmass;
      RealType momentum(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginFluctuatingCharge(iiter); atom != NULL;
             atom = mol->nextFluctuatingCharge(iiter)) {
          cmass = atom->getChargeMass();
          cvel  = atom->getFlucQVel();

          momentum += cmass * cvel;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &momentum, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      snap->setChargeMomentum(momentum);
    }

    return snap->getChargeMomentum();
  }